

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_strmatch_fuzzy_text(char *str,int str_len,char *pattern,int *out_score)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  char *pattern_iter;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  char *pcVar15;
  char *pcVar16;
  int iVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  
  iVar7 = 0;
  if (pattern != (char *)0x0 && (str_len != 0 && str != (char *)0x0)) {
    uVar10 = (ulong)(uint)str_len;
    if (str_len < 1) {
      uVar10 = 0;
    }
    bVar5 = true;
    pcVar15 = (char *)0x0;
    uVar8 = 0;
    bVar21 = false;
    bVar3 = 0;
    iVar13 = 0;
    pcVar16 = pattern;
    for (lVar6 = 0; uVar10 * 3 + lVar6 != 0; lVar6 = lVar6 + -3) {
      cVar1 = *pcVar16;
      iVar7 = (int)cVar1;
      cVar2 = *str;
      iVar17 = (int)cVar2;
      if (cVar1 == '\0') {
        bVar18 = false;
      }
      else {
        iVar4 = iVar7 + -0xa2;
        if (0x19 < iVar7 - 0x41U) {
          iVar4 = iVar7;
        }
        iVar11 = iVar17 + -0xa2;
        if (0x19 < iVar17 - 0x41U) {
          iVar11 = iVar17;
        }
        bVar18 = iVar4 == iVar11;
      }
      if (pcVar15 == (char *)0x0) {
        bVar19 = false;
        bVar20 = false;
        bVar14 = false;
      }
      else {
        iVar11 = (int)*pcVar15;
        iVar4 = iVar11 + -0xa2;
        if (0x19 < iVar11 - 0x41U) {
          iVar4 = iVar11;
        }
        iVar11 = iVar17 + -0xa2;
        if (0x19 < iVar17 - 0x41U) {
          iVar11 = iVar17;
        }
        bVar19 = iVar4 == iVar11;
        bVar14 = bVar18;
        if (cVar1 == '\0') {
          bVar20 = false;
        }
        else {
          iVar11 = iVar7 + -0xa2;
          if (0x19 < iVar7 - 0x41U) {
            iVar11 = iVar7;
          }
          bVar20 = iVar4 == iVar11;
        }
      }
      if (bVar14 != false || bVar20) {
        uVar12 = uVar8;
        pcVar15 = (char *)0x0;
        uVar8 = 0;
      }
      else {
        uVar12 = 0;
      }
      iVar13 = uVar12 + iVar13;
      if ((bVar19 | bVar18) == 1) {
        if (pcVar16 == pattern) {
          iVar7 = -9;
          if (-9 < (int)lVar6) {
            iVar7 = (int)lVar6;
          }
          iVar13 = iVar13 + iVar7;
        }
        uVar12 = (uint)bVar3 * 5 + 10;
        if (!bVar5) {
          uVar12 = (uint)bVar3 * 5;
        }
        uVar9 = uVar12 + 10;
        if (iVar17 - 0x5bU < 0xffffffe6) {
          uVar9 = uVar12;
        }
        if (!bVar21) {
          uVar9 = uVar12;
        }
        pcVar16 = pcVar16 + bVar18;
        bVar21 = pcVar15 != (char *)0x0;
        bVar5 = uVar8 <= uVar9;
        if (uVar8 <= uVar9) {
          pcVar15 = str;
        }
        if (uVar8 < uVar9) {
          uVar8 = uVar9;
        }
        iVar13 = iVar13 - (uint)(bVar5 && bVar21);
        bVar3 = 1;
      }
      else {
        iVar13 = iVar13 + -1;
        bVar3 = 0;
      }
      bVar21 = iVar17 - 0x61U < 0x1a;
      bVar5 = cVar2 == ' ' || cVar2 == '_';
      str = str + 1;
    }
    iVar7 = 0;
    if (pcVar15 == (char *)0x0) {
      uVar8 = 0;
    }
    if ((*pcVar16 == '\0') && (iVar7 = 1, out_score != (int *)0x0)) {
      *out_score = iVar13 + uVar8;
      return 1;
    }
  }
  return iVar7;
}

Assistant:

NK_API int
nk_strmatch_fuzzy_text(const char *str, int str_len,
    const char *pattern, int *out_score)
{
    /* Returns true if each character in pattern is found sequentially within str
     * if found then outScore is also set. Score value has no intrinsic meaning.
     * Range varies with pattern. Can only compare scores with same search pattern. */

    /* ------- scores --------- */
    /* bonus for adjacent matches */
    #define NK_ADJACENCY_BONUS 5
    /* bonus if match occurs after a separator */
    #define NK_SEPARATOR_BONUS 10
    /* bonus if match is uppercase and prev is lower */
    #define NK_CAMEL_BONUS 10
    /* penalty applied for every letter in str before the first match */
    #define NK_LEADING_LETTER_PENALTY (-3)
    /* maximum penalty for leading letters */
    #define NK_MAX_LEADING_LETTER_PENALTY (-9)
    /* penalty for every letter that doesn't matter */
    #define NK_UNMATCHED_LETTER_PENALTY (-1)

    /* loop variables */
    int score = 0;
    char const * pattern_iter = pattern;
    int str_iter = 0;
    int prev_matched = nk_false;
    int prev_lower = nk_false;
    /* true so if first letter match gets separator bonus*/
    int prev_separator = nk_true;

    /* use "best" matched letter if multiple string letters match the pattern */
    char const * best_letter = 0;
    int best_letter_score = 0;

    /* loop over strings */
    NK_ASSERT(str);
    NK_ASSERT(pattern);
    if (!str || !str_len || !pattern) return 0;
    while (str_iter < str_len)
    {
        const char pattern_letter = *pattern_iter;
        const char str_letter = str[str_iter];

        int next_match = *pattern_iter != '\0' &&
            nk_to_lower(pattern_letter) == nk_to_lower(str_letter);
        int rematch = best_letter && nk_to_lower(*best_letter) == nk_to_lower(str_letter);

        int advanced = next_match && best_letter;
        int pattern_repeat = best_letter && *pattern_iter != '\0';
        pattern_repeat = pattern_repeat &&
            nk_to_lower(*best_letter) == nk_to_lower(pattern_letter);

        if (advanced || pattern_repeat) {
            score += best_letter_score;
            best_letter = 0;
            best_letter_score = 0;
        }

        if (next_match || rematch)
        {
            int new_score = 0;
            /* Apply penalty for each letter before the first pattern match */
            if (pattern_iter == pattern) {
                int count = (int)(&str[str_iter] - str);
                int penalty = NK_LEADING_LETTER_PENALTY * count;
                if (penalty < NK_MAX_LEADING_LETTER_PENALTY)
                    penalty = NK_MAX_LEADING_LETTER_PENALTY;

                score += penalty;
            }

            /* apply bonus for consecutive bonuses */
            if (prev_matched)
                new_score += NK_ADJACENCY_BONUS;

            /* apply bonus for matches after a separator */
            if (prev_separator)
                new_score += NK_SEPARATOR_BONUS;

            /* apply bonus across camel case boundaries */
            if (prev_lower && nk_is_upper(str_letter))
                new_score += NK_CAMEL_BONUS;

            /* update pattern iter IFF the next pattern letter was matched */
            if (next_match)
                ++pattern_iter;

            /* update best letter in str which may be for a "next" letter or a rematch */
            if (new_score >= best_letter_score) {
                /* apply penalty for now skipped letter */
                if (best_letter != 0)
                    score += NK_UNMATCHED_LETTER_PENALTY;

                best_letter = &str[str_iter];
                best_letter_score = new_score;
            }
            prev_matched = nk_true;
        } else {
            score += NK_UNMATCHED_LETTER_PENALTY;
            prev_matched = nk_false;
        }

        /* separators should be more easily defined */
        prev_lower = nk_is_lower(str_letter) != 0;
        prev_separator = str_letter == '_' || str_letter == ' ';

        ++str_iter;
    }

    /* apply score for last match */
    if (best_letter)
        score += best_letter_score;

    /* did not match full pattern */
    if (*pattern_iter != '\0')
        return nk_false;

    if (out_score)
        *out_score = score;
    return nk_true;
}